

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void add_generator<trng::yarn3>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
                *func_map)

{
  parameter_type P;
  char *pcVar1;
  yarn3 r;
  int in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  allocator *__f;
  function<void_(unsigned_long,_unsigned_long)> *in_stack_ffffffffffffff80;
  allocator local_69;
  key_type *in_stack_ffffffffffffff98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
  *in_stack_ffffffffffffffa0;
  
  P.a._4_8_ = in_stack_ffffffffffffff70;
  P.a[0] = in_stack_ffffffffffffff6c;
  trng::yarn3::yarn3((yarn3 *)0x103db3,P);
  pcVar1 = trng::yarn3::name();
  __f = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,pcVar1,__f);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
  ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::function<void(unsigned_long,unsigned_long)>::operator=
            (in_stack_ffffffffffffff80,(anon_class_1_0_00000001 *)__f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void add_generator(
    std::map<std::string, std::function<void(std::size_t, unsigned long)>> &func_map) {
  const R r;
  func_map[r.name()] = [&](std::size_t samples, unsigned long seed) {
    generate<R>(samples, seed);
  };
}